

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.cpp
# Opt level: O2

Debug * __thiscall Corrade::Utility::Debug::operator<<(Debug *this,char32_t *value)

{
  Debug *pDVar1;
  allocator<char32_t> local_31;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_30;
  
  std::__cxx11::u32string::u32string((u32string *)&local_30,value,&local_31);
  pDVar1 = operator<<<char32_t,_0>(this,&local_30);
  std::__cxx11::u32string::~u32string((u32string *)&local_30);
  return pDVar1;
}

Assistant:

Debug& Debug::operator<<(const char32_t* value) {
    return *this << std::u32string(value);
}